

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.h
# Opt level: O2

void __thiscall Coin::Serialize<AutoFile>(Coin *this,AutoFile *s)

{
  long in_FS_OFFSET;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> local_28;
  uint32_t code;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->out).nValue == -1) {
    __assert_fail("!IsSpent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/coins.h"
                  ,0x3f,"void Coin::Serialize(Stream &) const [Stream = AutoFile]");
  }
  code = *(uint32_t *)&this->field_0x28;
  local_28.m_object = &code;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&>::Serialize<AutoFile>(&local_28,s);
  TxOutCompression::SerializationOps<AutoFile,CTxOut_const,ActionSerialize>(this,s);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream &s) const {
        assert(!IsSpent());
        uint32_t code = nHeight * uint32_t{2} + fCoinBase;
        ::Serialize(s, VARINT(code));
        ::Serialize(s, Using<TxOutCompression>(out));
    }